

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O1

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pMVar7;
  int *piVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  DeconvolutionDepthWise *this_00;
  uint uVar11;
  int iVar12;
  Allocator **ppAVar13;
  int _c;
  int iVar14;
  int iVar15;
  ulong uVar16;
  void *pvVar17;
  long lVar18;
  ulong uVar19;
  void *pvVar20;
  void *pvVar21;
  ulong uVar22;
  ulong uVar23;
  void *pvVar24;
  ulong uVar25;
  uint uVar26;
  undefined1 auVar27 [16];
  Option *pOVar28;
  Mat local_1b8;
  pointer local_170;
  ulong local_168;
  ulong local_160;
  int local_154;
  Option *local_150;
  DeconvolutionDepthWise *local_148;
  pointer local_140;
  Mat local_138;
  Mat local_e8;
  Mat local_98;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_50;
  void *local_48;
  void *local_40;
  long local_38;
  
  local_140 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  pMVar7 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar14 = local_140->c;
  local_160 = (ulong)(uint)local_140[1].w;
  _c = this->group * local_140[1].d;
  local_168 = (ulong)(uint)local_140[1].h;
  local_98.cstep = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.elemsize._0_4_ = 0;
  local_98._20_8_ = 0;
  local_98.allocator = (Allocator *)0x0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.d = 0;
  local_98.c = 0;
  local_50 = bottom_blobs;
  flatten(local_140 + 1,&local_98,opt);
  iVar12 = -100;
  if ((local_98.data == (void *)0x0) || ((long)local_98.c * local_98.cstep == 0)) goto LAB_0046633c;
  local_e8.cstep = 0;
  uVar26 = (int)local_168 * (int)local_160;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8._20_8_ = 0;
  local_e8.allocator = (Allocator *)0x0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
  local_150 = opt;
  local_148 = this;
  Mat::create(&local_e8,(int)(uVar26 * iVar14 * _c) / this->group,4,opt->workspace_allocator);
  this_00 = local_148;
  pOVar28 = local_150;
  iVar12 = -100;
  local_40 = local_e8.data;
  if ((local_e8.data != (void *)0x0) && ((long)local_e8.c * local_e8.cstep != 0)) {
    iVar12 = local_148->group;
    local_38 = (long)iVar12;
    uVar11 = _c / iVar12;
    uVar23 = (long)iVar14 / (long)iVar12;
    if (0 < local_38) {
      local_48 = local_98.data;
      uVar22 = (ulong)uVar26;
      iVar12 = (int)uVar23;
      uVar23 = uVar23 & 0xffffffff;
      local_154 = uVar26 * iVar12 * uVar11;
      iVar14 = 0;
      lVar18 = 0;
      do {
        if (0 < (int)uVar11) {
          pvVar24 = (void *)((long)local_e8.data + (long)iVar14 * 4);
          pvVar21 = (void *)((long)local_98.data + (long)iVar14 * 4);
          uVar16 = 0;
          do {
            if (0 < iVar12) {
              uVar19 = 0;
              pvVar17 = pvVar24;
              pvVar20 = pvVar21;
              do {
                if (0 < (int)uVar26) {
                  uVar25 = 0;
                  do {
                    *(undefined4 *)((long)pvVar17 + uVar25 * 4) =
                         *(undefined4 *)((long)pvVar20 + uVar25 * 4);
                    uVar25 = uVar25 + 1;
                  } while (uVar22 != uVar25);
                }
                uVar19 = uVar19 + 1;
                pvVar17 = (void *)((long)pvVar17 + uVar22 * 4);
                pvVar20 = (void *)((long)pvVar20 + uVar11 * uVar22 * 4);
              } while (uVar19 != uVar23);
            }
            uVar16 = uVar16 + 1;
            pvVar24 = (void *)((long)pvVar24 + uVar23 * uVar22 * 4);
            pvVar21 = (void *)((long)pvVar21 + uVar22 * 4);
          } while (uVar16 != uVar11);
        }
        lVar18 = lVar18 + 1;
        iVar14 = iVar14 + local_154;
      } while (lVar18 != local_38);
    }
    local_138.cstep = 0;
    local_138.data = (void *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138._20_8_ = 0;
    local_138.allocator = (Allocator *)0x0;
    local_138.dims = 0;
    local_138.w = 0;
    local_138.h = 0;
    local_138.d = 0;
    local_138.c = 0;
    local_170 = pMVar7;
    if (local_148->bias_term == 0) {
LAB_00465f5c:
      iVar14 = this_00->dilation_w;
      iVar12 = local_140->w;
      iVar1 = this_00->stride_w;
      ppAVar13 = &pOVar28->workspace_allocator;
      iVar2 = this_00->dilation_h;
      iVar3 = local_140->h;
      iVar4 = this_00->stride_h;
      iVar5 = this_00->output_pad_right;
      iVar6 = this_00->output_pad_bottom;
      local_1b8.cstep = 0;
      local_1b8.data = (void *)0x0;
      local_1b8.refcount._0_4_ = 0;
      local_1b8.refcount._4_4_ = 0;
      local_1b8.elemsize._0_4_ = 0;
      local_1b8.elemsize._4_4_ = 0;
      local_1b8.elempack = 0;
      local_1b8.allocator = (Allocator *)0x0;
      local_1b8.dims = 0;
      local_1b8.w = 0;
      local_1b8.h = 0;
      local_1b8.d = 0;
      local_1b8.c = 0;
      auVar27._0_4_ = -(uint)(0 < this_00->pad_left);
      auVar27._4_4_ = -(uint)(0 < this_00->pad_right);
      auVar27._8_4_ = -(uint)(0 < this_00->pad_top);
      auVar27._12_4_ = -(uint)(0 < this_00->pad_bottom);
      iVar15 = movmskps((int)&local_1b8 + 0x28,auVar27);
      if ((iVar15 == 0) && ((this_00->output_w < 1 || (this_00->output_h < 1)))) {
        if (&local_1b8 != local_170) {
          piVar8 = local_170->refcount;
          if (piVar8 != (int *)0x0) {
            LOCK();
            *piVar8 = *piVar8 + 1;
            UNLOCK();
          }
          local_1b8.data = local_170->data;
          local_1b8.refcount._0_4_ = SUB84(local_170->refcount,0);
          local_1b8.refcount._4_4_ = (undefined4)((ulong)local_170->refcount >> 0x20);
          local_1b8.elemsize._0_4_ = (undefined4)local_170->elemsize;
          local_1b8.elemsize._4_4_ = (undefined4)(local_170->elemsize >> 0x20);
          local_1b8.elempack = local_170->elempack;
          local_1b8.allocator = local_170->allocator;
          uVar9 = local_170->dims;
          uVar10 = local_170->w;
          local_1b8.h = local_170->h;
          local_1b8.d = local_170->d;
          local_1b8.c = local_170->c;
          local_1b8.cstep = local_170->cstep;
          local_1b8.dims = uVar9;
          local_1b8.w = uVar10;
        }
        ppAVar13 = &pOVar28->blob_allocator;
      }
      pOVar28 = (Option *)0x466114;
      Mat::create(&local_1b8,iVar5 + ((int)local_160 + -1) * iVar14 + (iVar12 + -1) * iVar1 + 1,
                  iVar6 + 1 + ((int)local_168 + -1) * iVar2 + (iVar3 + -1) * iVar4,_c,4,*ppAVar13);
      iVar12 = -100;
      if ((local_1b8.data != (void *)0x0) && ((long)local_1b8.c * local_1b8.cstep != 0)) {
        deconvolutiondepthwise
                  (local_140,&local_1b8,&local_e8,&local_138,(int)local_160,(int)local_168,
                   this_00->stride_w,this_00->stride_h,this_00->dilation_w,this_00->dilation_h,
                   this_00->group,this_00->activation_type,&this_00->activation_params,pOVar28);
        pMVar7 = local_170;
        cut_padding(this_00,&local_1b8,local_170,local_150);
        if ((pMVar7->data != (void *)0x0) && (iVar12 = -100, (long)pMVar7->c * pMVar7->cstep != 0))
        {
          iVar12 = 0;
        }
      }
      piVar8 = (int *)CONCAT44(local_1b8.refcount._4_4_,local_1b8.refcount._0_4_);
      if (piVar8 != (int *)0x0) {
        LOCK();
        *piVar8 = *piVar8 + -1;
        UNLOCK();
        if (*piVar8 == 0) {
          if (local_1b8.allocator == (Allocator *)0x0) {
            if (local_1b8.data != (void *)0x0) {
              free(local_1b8.data);
            }
          }
          else {
            (*(local_1b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_1b8.cstep = 0;
      local_1b8.data = (void *)0x0;
      local_1b8.refcount._0_4_ = 0;
      local_1b8.refcount._4_4_ = 0;
      local_1b8.elemsize._0_4_ = 0;
      local_1b8.elemsize._4_4_ = 0;
      local_1b8.elempack = 0;
      local_1b8.dims = 0;
      local_1b8.w = 0;
      local_1b8.h = 0;
      local_1b8.d = 0;
      local_1b8.c = 0;
    }
    else {
      flatten((local_50->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,&local_138,local_150);
      iVar12 = -100;
      if ((local_138.data != (void *)0x0) && ((long)local_138.c * local_138.cstep != 0))
      goto LAB_00465f5c;
    }
    piVar8 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        if (local_138.allocator == (Allocator *)0x0) {
          if (local_138.data != (void *)0x0) {
            free(local_138.data);
          }
        }
        else {
          (*(local_138.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_138.cstep = 0;
    local_138.data = (void *)0x0;
    local_138.refcount._0_4_ = 0;
    local_138.refcount._4_4_ = 0;
    local_138.elemsize._0_4_ = 0;
    local_138._20_8_ = 0;
    local_138.dims = 0;
    local_138.w = 0;
    local_138.h = 0;
    local_138.d = 0;
    local_138.c = 0;
  }
  piVar8 = (int *)CONCAT44(local_e8.refcount._4_4_,local_e8.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        if (local_e8.data != (void *)0x0) {
          free(local_e8.data);
        }
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_e8.cstep = 0;
  local_e8.data = (void *)0x0;
  local_e8.refcount._0_4_ = 0;
  local_e8.refcount._4_4_ = 0;
  local_e8.elemsize._0_4_ = 0;
  local_e8._20_8_ = 0;
  local_e8.dims = 0;
  local_e8.w = 0;
  local_e8.h = 0;
  local_e8.d = 0;
  local_e8.c = 0;
LAB_0046633c:
  piVar8 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (piVar8 != (int *)0x0) {
    LOCK();
    *piVar8 = *piVar8 + -1;
    UNLOCK();
    if (*piVar8 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (*(local_98.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar12;
}

Assistant:

int DeconvolutionDepthWise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * group;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / group, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / group;
        const int inch_g = _num_input / group;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < group; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}